

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

string * __thiscall
google::protobuf::Message::DebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  bool v;
  undefined1 local_a8 [8];
  Printer printer;
  Message *this_local;
  string *debug_string;
  
  printer.finder_._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TextFormat::Printer::Printer((Printer *)local_a8);
  TextFormat::Printer::SetExpandAny((Printer *)local_a8,true);
  v = std::atomic<bool>::load
                ((atomic<bool> *)&internal::enable_debug_text_format_marker,memory_order_relaxed);
  TextFormat::Printer::SetInsertSilentMarker((Printer *)local_a8,v);
  TextFormat::Printer::PrintToString((Printer *)local_a8,this,__return_storage_ptr__);
  printer.finder_._7_1_ = 1;
  TextFormat::Printer::~Printer((Printer *)local_a8);
  if ((printer.finder_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Message::DebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetExpandAny(true);
  printer.SetInsertSilentMarker(internal::enable_debug_text_format_marker.load(
      std::memory_order_relaxed));

  printer.PrintToString(*this, &debug_string);

  return debug_string;
}